

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupAbsGates(Gia_Man_t *p,Vec_Int_t *vGateClasses)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Gia_Man_t *pGVar11;
  uint *puVar12;
  Vec_Int_t *pVVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  Vec_Int_t *vFlops;
  Vec_Int_t *vNodes;
  Vec_Int_t *vPPis;
  Vec_Int_t *vPis;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  if (p->vCos->nSize - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                  ,0xe2,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
  }
  if (vGateClasses->nSize != p->nObjs) {
    __assert_fail("Vec_IntSize(vGateClasses) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                  ,0xe3,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
  }
  local_38 = vGateClasses;
  Gia_ManGlaCollect(p,vGateClasses,&local_40,&local_48,&local_58,&local_50);
  p_00 = Gia_ManStart(5000);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  if (0 < local_40->nSize) {
    lVar17 = 0;
    do {
      iVar14 = local_40->pArray[lVar17];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_00602110;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar16 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_0060212f;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_0060212f;
      pGVar3[iVar14].Value = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
    } while (lVar17 < local_40->nSize);
  }
  if (0 < local_48->nSize) {
    lVar17 = 0;
    do {
      iVar14 = local_48->pArray[lVar17];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_00602110;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar16 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_0060212f;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_0060212f;
      pGVar3[iVar14].Value = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
    } while (lVar17 < local_48->nSize);
  }
  if (0 < local_58->nSize) {
    lVar17 = 0;
    do {
      iVar14 = local_58->pArray[lVar17];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_00602110;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar16 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) {
LAB_0060212f:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_0060212f;
      pGVar3[iVar14].Value = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
    } while (lVar17 < local_58->nSize);
  }
  if (0 < local_50->nSize) {
    lVar17 = 0;
    do {
      iVar14 = local_50->pArray[lVar17];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_00602110;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar14;
      uVar16 = *(ulong *)pGVar3;
      if (((int)pGVar3[-(ulong)((uint)uVar16 & 0x1fffffff)].Value < 0) ||
         (uVar6 = (uint)(uVar16 >> 0x20), (int)pGVar3[-(ulong)(uVar6 & 0x1fffffff)].Value < 0))
      goto LAB_0060216d;
      uVar6 = Gia_ManAppendAnd(p_00,(uint)(uVar16 >> 0x1d) & 1 ^
                                    pGVar3[-(ulong)((uint)uVar16 & 0x1fffffff)].Value,
                               pGVar3[-(ulong)(uVar6 & 0x1fffffff)].Value ^ uVar6 >> 0x1d & 1);
      pGVar3->Value = uVar6;
      lVar17 = lVar17 + 1;
    } while (lVar17 < local_50->nSize);
  }
  iVar14 = p->nRegs;
  pVVar13 = p->vCos;
  iVar7 = pVVar13->nSize;
  if (iVar14 < iVar7) {
    lVar17 = 0;
    do {
      if (iVar7 <= lVar17) goto LAB_0060218c;
      iVar7 = pVVar13->pArray[lVar17];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00602110;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar7;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0)
      goto LAB_0060216d;
      uVar6 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                   pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value)
      ;
      pGVar3->Value = uVar6;
      lVar17 = lVar17 + 1;
      iVar14 = p->nRegs;
      pVVar13 = p->vCos;
      iVar7 = pVVar13->nSize;
    } while (lVar17 < iVar7 - iVar14);
  }
  uVar6 = local_58->nSize;
  uVar16 = (ulong)uVar6;
  if (0 < (int)uVar6) {
    lVar17 = 0;
    do {
      uVar6 = (uint)uVar16;
      iVar7 = local_58->pArray[lVar17];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00602110;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar5 = *(undefined8 *)(pGVar3 + iVar7);
      if (((uint)uVar5 & 0x9fffffff) != 0x9fffffff) {
LAB_0060214e:
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar6 = (uint)((ulong)uVar5 >> 0x20) & 0x1fffffff;
      iVar1 = p->vCis->nSize;
      if ((int)uVar6 < iVar1 - iVar14) goto LAB_0060214e;
      uVar6 = (pVVar13->nSize - iVar1) + uVar6;
      if (((int)uVar6 < 0) || (pVVar13->nSize <= (int)uVar6)) {
LAB_0060218c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar6 = pVVar13->pArray[uVar6];
      if (((long)(int)uVar6 < 0) || ((uint)p->nObjs <= uVar6)) goto LAB_00602110;
      uVar15 = (uint)*(undefined8 *)(pGVar3 + (int)uVar6);
      uVar6 = (pGVar3 + (int)uVar6)[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar6 < 0) {
LAB_0060216d:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar6 = Gia_ManAppendCo(p_00,uVar15 >> 0x1d & 1 ^ uVar6);
      uVar5 = *(undefined8 *)(pGVar3 + iVar7);
      if (((uint)uVar5 & 0x9fffffff) != 0x9fffffff) goto LAB_0060214e;
      uVar15 = (uint)((ulong)uVar5 >> 0x20) & 0x1fffffff;
      iVar14 = p->nRegs;
      iVar7 = p->vCis->nSize;
      if ((int)uVar15 < iVar7 - iVar14) goto LAB_0060214e;
      pVVar13 = p->vCos;
      uVar15 = (pVVar13->nSize - iVar7) + uVar15;
      if (((int)uVar15 < 0) || (pVVar13->nSize <= (int)uVar15)) goto LAB_0060218c;
      iVar7 = pVVar13->pArray[uVar15];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00602110;
      p->pObjs[iVar7].Value = uVar6;
      lVar17 = lVar17 + 1;
      uVar6 = local_58->nSize;
      uVar16 = (ulong)(int)uVar6;
    } while (lVar17 < (long)uVar16);
  }
  Gia_ManSetRegNum(p_00,uVar6);
  pGVar11 = Gia_ManSeqCleanup(p_00);
  if (p_00->nObjs != pGVar11->nObjs) {
    iVar14 = p->nObjs;
    if ((0 < iVar14) && (p->pObjs != (Gia_Obj_t *)0x0)) {
      puVar12 = &p->pObjs->Value;
      lVar17 = 0;
      do {
        uVar6 = *puVar12;
        if (uVar6 != 0xffffffff) {
          if ((int)uVar6 < 0) {
LAB_006021ab:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          if ((uVar6 & 1) != 0) {
            __assert_fail("!Abc_LitIsCompl(pObj->Value)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                          ,0x10d,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
          }
          if (p_00->nObjs <= (int)(uVar6 >> 1)) {
LAB_00602110:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar6 = p_00->pObjs[uVar6 >> 1].Value;
          if (uVar6 == 0xffffffff) {
            if (local_38->nSize <= lVar17) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            local_38->pArray[lVar17] = 0;
            *puVar12 = 0xffffffff;
            iVar14 = p->nObjs;
          }
          else {
            if ((int)uVar6 < 0) goto LAB_006021ab;
            if ((uVar6 & 1) != 0) {
              __assert_fail("!Abc_LitIsCompl(pCopy->Value)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                            ,0x115,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
            }
            *puVar12 = uVar6;
          }
        }
        lVar17 = lVar17 + 1;
        puVar12 = puVar12 + 3;
      } while (lVar17 < iVar14);
    }
  }
  Gia_ManStop(p_00);
  if (local_40->pArray != (int *)0x0) {
    free(local_40->pArray);
  }
  free(local_40);
  if (local_48->pArray != (int *)0x0) {
    free(local_48->pArray);
  }
  free(local_48);
  if (local_58->pArray != (int *)0x0) {
    free(local_58->pArray);
  }
  free(local_58);
  if (local_50->pArray != (int *)0x0) {
    free(local_50->pArray);
  }
  free(local_50);
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_ManDupAbsGates( Gia_Man_t * p, Vec_Int_t * vGateClasses )
{ 
    Vec_Int_t * vPis, * vPPis, * vFlops, * vNodes;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pCopy;
    int i;//, nFlops = 0;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Vec_IntSize(vGateClasses) == Gia_ManObjNum(p) );

    // create additional arrays
    Gia_ManGlaCollect( p, vGateClasses, &vPis, &vPPis, &vFlops, &vNodes );

    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create constant
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    Gia_ManForEachObjVec( vPis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create additional PIs
    Gia_ManForEachObjVec( vPPis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create ROs
    Gia_ManForEachObjVec( vFlops, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
//        Gia_ManDupAbsGates_rec( pNew, pObj );
    // create PO
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // create RIs
    Gia_ManForEachObjVec( vFlops, p, pObj, i )
        Gia_ObjRoToRi(p, pObj)->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ObjRoToRi(p, pObj)) );
    Gia_ManSetRegNum( pNew, Vec_IntSize(vFlops) );
    // clean up
    pNew = Gia_ManSeqCleanup( pTemp = pNew );
    // transfer copy values: (p -> pTemp -> pNew) => (p -> pNew)
    if ( Gia_ManObjNum(pTemp) != Gia_ManObjNum(pNew) )
    {
//        printf( "Gia_ManDupAbsGates() Internal error: object mismatch.\n" );
        Gia_ManForEachObj( p, pObj, i )
        {
            if ( !~pObj->Value )
                continue;
            assert( !Abc_LitIsCompl(pObj->Value) );
            pCopy = Gia_ObjCopy( pTemp, pObj );
            if ( !~pCopy->Value )
            {
                Vec_IntWriteEntry( vGateClasses, i, 0 );
                pObj->Value = ~0;
                continue;
            }
            assert( !Abc_LitIsCompl(pCopy->Value) );
            pObj->Value = pCopy->Value;
        }
    }
    Gia_ManStop( pTemp );

    Vec_IntFree( vPis );
    Vec_IntFree( vPPis );
    Vec_IntFree( vFlops );
    Vec_IntFree( vNodes );
    return pNew;
}